

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

AggregateFunction *
duckdb::GetTypedEntropyFunction<double,duckdb::ModeStandard<double>>(LogicalType *type)

{
  LogicalType *in_RSI;
  AggregateFunction *in_RDI;
  AggregateFunction *func;
  AggregateFunction *pAVar1;
  LogicalType local_48 [24];
  LogicalType local_30 [31];
  undefined1 local_11;
  AggregateFunction *input_type;
  
  local_11 = 0;
  pAVar1 = in_RDI;
  input_type = in_RDI;
  duckdb::LogicalType::LogicalType(local_30,in_RSI);
  duckdb::LogicalType::LogicalType(local_48,DOUBLE);
  AggregateFunction::
  UnaryAggregateDestructor<duckdb::ModeState<double,duckdb::ModeStandard<double>>,double,double,duckdb::EntropyFunction<duckdb::ModeStandard<double>>,(duckdb::AggregateDestructorType)1>
            ((LogicalType *)input_type,in_RSI);
  duckdb::LogicalType::~LogicalType(local_48);
  duckdb::LogicalType::~LogicalType(local_30);
  in_RDI->field_0xa9 = 1;
  return pAVar1;
}

Assistant:

AggregateFunction GetTypedEntropyFunction(const LogicalType &type) {
	using STATE = ModeState<INPUT_TYPE, TYPE_OP>;
	using OP = EntropyFunction<TYPE_OP>;
	auto func =
	    AggregateFunction::UnaryAggregateDestructor<STATE, INPUT_TYPE, double, OP, AggregateDestructorType::LEGACY>(
	        type, LogicalType::DOUBLE);
	func.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	return func;
}